

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O1

DdNode * Cudd_addTimesPlus(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar1;
  long lVar2;
  
  n = Cudd_addApply(dd,Cudd_addTimes,A,B);
  if (n != (DdNode *)0x0) {
    Cudd_Ref(n);
    n_00 = dd->one;
    Cudd_Ref(n_00);
    if (0 < nz) {
      lVar2 = (ulong)(uint)nz + 1;
      pDVar1 = n_00;
      do {
        n_00 = Cudd_addIte(dd,z[lVar2 + -2],pDVar1,dd->zero);
        if (n_00 == (DdNode *)0x0) goto LAB_007d7f19;
        Cudd_Ref(n_00);
        Cudd_RecursiveDeref(dd,pDVar1);
        lVar2 = lVar2 + -1;
        pDVar1 = n_00;
      } while (1 < lVar2);
    }
    pDVar1 = Cudd_addExistAbstract(dd,n,n_00);
    if (pDVar1 != (DdNode *)0x0) {
      Cudd_Ref(pDVar1);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
      Cudd_Deref(pDVar1);
      return pDVar1;
    }
    Cudd_RecursiveDeref(dd,n);
    n = n_00;
LAB_007d7f19:
    Cudd_RecursiveDeref(dd,n);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addTimesPlus(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    DdNode *w, *cube, *tmp, *res; 
    int i;
    tmp = Cudd_addApply(dd,Cudd_addTimes,A,B);
    if (tmp == NULL) return(NULL);
    Cudd_Ref(tmp);
    Cudd_Ref(cube = DD_ONE(dd));
    for (i = nz-1; i >= 0; i--) {
         w = Cudd_addIte(dd,z[i],cube,DD_ZERO(dd));
         if (w == NULL) {
            Cudd_RecursiveDeref(dd,tmp);
            return(NULL);
         }
         Cudd_Ref(w);
         Cudd_RecursiveDeref(dd,cube);
         cube = w;
    }
    res = Cudd_addExistAbstract(dd,tmp,cube);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,tmp);
        Cudd_RecursiveDeref(dd,cube);
        return(NULL);
    }
    Cudd_Ref(res);
    Cudd_RecursiveDeref(dd,cube);
    Cudd_RecursiveDeref(dd,tmp);
    Cudd_Deref(res);
    return(res);

}